

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

TCGv_i32 gen_load_gpr(DisasContext_conflict8 *dc,int reg)

{
  TCGContext_conflict8 *tcg_ctx_00;
  TCGv_i32 t;
  TCGContext_conflict8 *tcg_ctx;
  int reg_local;
  DisasContext_conflict8 *dc_local;
  
  tcg_ctx_00 = dc->uc->tcg_ctx;
  if (reg < 1) {
    dc_local = (DisasContext_conflict8 *)get_temp_tl(dc);
    tcg_gen_movi_i64_sparc64(tcg_ctx_00,(TCGv_i32)dc_local,0);
  }
  else {
    if (0x1f < reg) {
      __assert_fail("reg < 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/sparc/translate.c"
                    ,0x12a,"TCGv_i64 gen_load_gpr(DisasContext *, int)");
    }
    dc_local = (DisasContext_conflict8 *)tcg_ctx_00->cpu_regs[reg];
  }
  return (TCGv_i32)dc_local;
}

Assistant:

static inline void gen_load_gpr(TCGContext *tcg_ctx, TCGv t, int reg)
{
    if (reg == 0) {
        tcg_gen_movi_tl(tcg_ctx, t, 0);
    } else {
        tcg_gen_mov_tl(tcg_ctx, t, tcg_ctx->cpu_gpr[reg]);
    }
}